

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Visible_By_Fly_Apart_Start_Do_proc(Am_Object *interp)

{
  unsigned_short uVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object owner;
  Am_Value value2;
  Am_Value_List new_objs;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value local_30;
  Am_Value_List local_20;
  
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(interp,0x182,1);
  Am_Value::operator=(&local_30,pAVar2);
  Am_Value::Valid(&local_30);
  pAVar2 = Am_Object::Get(interp,0x193,0);
  Am_Object::Am_Object(&local_38,pAVar2);
  break_up_objects((Am_Object *)&local_20,interp,SUB81(&local_38,0));
  value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_20);
  Am_Object::Set(interp,0x82,value,1);
  uVar1 = Am_Value_List::Length(&local_20);
  Am_Object::Set(interp,0x10e,(uint)uVar1,1);
  Am_Object::Set(interp,0x169,false,0);
  Am_Object::Am_Object(&local_40,interp);
  Am_Set_Animated_Slots(&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List(&local_20);
  Am_Object::~Am_Object(&local_38);
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Visible_By_Fly_Apart_Start_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Animator Start of " << interp);

  Am_Value value2;
  value2 = interp.Peek(Am_VALUE_2);
  bool vis = value2.Valid(); //going visible?

  Am_Object owner = interp.Get(Am_OPERATES_ON);
  Am_Value_List new_objs = break_up_objects(interp, owner, vis);
  interp.Set(Am_GRAPHICAL_PARTS, new_objs, Am_OK_IF_NOT_THERE);
  //countdown of number of anims
  interp.Set(Am_WIGGLES, new_objs.Length(), Am_OK_IF_NOT_THERE);

  //whether getting visible or not, be invisible during animation
  interp.Set(Am_VALUE, false);

  // don't register a timer here!
  // the sub-animators will do all the animating, and then call us
  // back when their done

  Am_Set_Animated_Slots(interp);
}